

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O2

ssize_t __thiscall tcu::FileResource::read(FileResource *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  TestError *this_00;
  undefined4 in_register_00000034;
  
  sVar1 = fread((void *)CONCAT44(in_register_00000034,__fd),1,(long)(int)__buf,(FILE *)this->m_file)
  ;
  if ((int)sVar1 == (int)__buf) {
    return sVar1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_00,(char *)0x0,"numRead == numBytes",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuResource.cpp"
             ,0x40);
  __cxa_throw(this_00,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

void FileResource::read (deUint8* dst, int numBytes)
{
	int numRead = (int)fread(dst, 1, numBytes, m_file);
	TCU_CHECK(numRead == numBytes);
}